

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

void __thiscall Map::Map(Map *this)

{
  int iVar1;
  PlayerController *pPVar2;
  time_t tVar3;
  bool bVar4;
  
  (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scenes).super__Vector_base<Scene_*,_std::allocator<Scene_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->player).entity._vptr_Player = (_func_int **)&PTR__Player_00117820;
  (this->player).entity.strength = 100;
  (this->player).entity.controller = (PlayerController *)0x0;
  (this->player).entity.backpack.super_BackpackEntry._vptr_BackpackEntry =
       (_func_int **)&PTR__Backpack_00117bb8;
  (this->player).entity.backpack.backpack.
  super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->player).entity.backpack.backpack.
           super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->player).entity.backpack.backpack.
           super__Vector_base<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->player).position.x = 0.0;
  (this->player).position.y = 0.0;
  std::operator<<((ostream *)&std::cout,"Map initialized\n");
  pPVar2 = (PlayerController *)operator_new(0x10);
  pPVar2->_vptr_PlayerController = (_func_int **)&PTR__PlayerController_00117a40;
  pPVar2[1]._vptr_PlayerController = (_func_int **)&this->player;
  (this->player).entity.controller = pPVar2;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar1 = rand();
  iVar1 = iVar1 % 8 + 7;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    generateScene(this);
  }
  return;
}

Assistant:

Map::Map() : player({0, 0}) {
    std::cout << "Map initialized\n";
    player.get().setController(new SimplePlayerController(&player.get()));
    srand((unsigned) time(nullptr));
    int times = rand() % 8 + 7;
    for (int i = 0; i < times; ++i) {
        generateScene();
    }
}